

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void unodb::test::detail::
     assert_result_eq<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
               (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *db,key_type key,value_view expected,char *file,int line)

{
  quiescent_state_on_scope_exit local_3c;
  char *pcStack_38;
  quiescent_state_on_scope_exit qsbr_after_get;
  char *file_local;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *db_local;
  value_view expected_local;
  key_type key_local;
  
  local_3c.exceptions_at_ctor = 0;
  pcStack_38 = file;
  quiescent_state_on_scope_exit::quiescent_state_on_scope_exit(&local_3c);
  do_assert_result_eq<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
            (db,key,expected,pcStack_38,line);
  quiescent_state_on_scope_exit::~quiescent_state_on_scope_exit(&local_3c);
  return;
}

Assistant:

void assert_result_eq(const Db &db, typename Db::key_type key,
                      unodb::value_view expected, const char *file, int line) {
  if constexpr (is_olc_db<Db>) {
    const quiescent_state_on_scope_exit qsbr_after_get{};
    do_assert_result_eq<Db>(db, key, expected, file, line);
  } else {
    do_assert_result_eq<Db>(db, key, expected, file, line);
  }
}